

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_reportSolverProgress(HModel *this)

{
  double dVar1;
  uint uVar2;
  pointer pcVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  timeval tv;
  timeval local_30;
  
  if (this->intOption[0] == 0) {
    return;
  }
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  dVar4 = ((double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) - (this->timer).startTime
  ;
  if (dVar4 < util_reportSolverProgress::nextReport) {
    return;
  }
  computeDuObj(this,2);
  pcVar3 = (this->modelName)._M_dataplus._M_p;
  dVar1 = this->objective;
  uVar2 = this->numberIteration;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  printf("PROGRESS %16s %20.10e %10d %10.3f\n",dVar1,
         SUB84(((double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) -
               (this->timer).startTime,0),pcVar3,(ulong)uVar2);
  if (50.0 <= dVar4) {
    if (dVar4 < 500.0) {
      dVar4 = (double)(int)(dVar4 + 1.0);
      goto LAB_001307fb;
    }
    uVar5 = 0x9999999a;
    uVar6 = 0x3fc99999;
  }
  else {
    uVar5 = 0;
    uVar6 = 0x40140000;
  }
  dVar4 = (double)(int)(dVar4 * (double)CONCAT44(uVar6,uVar5) + 1.0) / (double)CONCAT44(uVar6,uVar5)
  ;
LAB_001307fb:
  util_reportSolverProgress::nextReport = dVar4 + -1e-05;
  return;
}

Assistant:

void HModel::util_reportSolverProgress() {
  if (!intOption[INTOPT_PRINT_FLAG]) return;
  static double nextReport = 0;
  double currentTime = timer.getTime();
  if (currentTime >= nextReport) {
    computeDuObj();
    printf("PROGRESS %16s %20.10e %10d %10.3f\n", modelName.c_str(),
	   objective, numberIteration, timer.getTime());
    if (currentTime < 50) {
      nextReport = ((int) (5 * currentTime + 1)) / 5.0 - 0.00001;
    } else if (currentTime < 500) {
      nextReport = ((int) (currentTime + 1)) - 0.00001;
    } else {
      nextReport = ((int) (0.2 * currentTime + 1)) / 0.2 - 0.00001;
    }
  }
}